

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_avx2.c
# Opt level: O3

uint64_t aom_sum_sse_2d_i16_nxn_avx2(int16_t *src,int stride,int width,int height,int *sum)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int iVar7;
  undefined1 (*pauVar8) [32];
  long lVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  
  if (height < 1) {
    auVar14 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    iVar7 = 0;
    auVar10 = ZEXT1664((undefined1  [16])0x0);
    auVar13._8_2_ = 1;
    auVar13._0_8_ = 0x1000100010001;
    auVar13._10_2_ = 1;
    auVar13._12_2_ = 1;
    auVar13._14_2_ = 1;
    auVar13._16_2_ = 1;
    auVar13._18_2_ = 1;
    auVar13._20_2_ = 1;
    auVar13._22_2_ = 1;
    auVar13._24_2_ = 1;
    auVar13._26_2_ = 1;
    auVar13._28_2_ = 1;
    auVar13._30_2_ = 1;
    auVar12 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar15 = ZEXT1664((undefined1  [16])0x0);
      auVar14 = auVar15._0_32_;
      if (0 < width) {
        lVar9 = 0;
        pauVar8 = (undefined1 (*) [32])src;
        do {
          auVar14 = *pauVar8;
          auVar11 = *(undefined1 (*) [32])(*pauVar8 + (long)stride * 2);
          auVar1 = *(undefined1 (*) [32])(*pauVar8 + (long)(stride * 2) * 2);
          auVar2 = *(undefined1 (*) [32])(*pauVar8 + (long)(stride * 3) * 2);
          auVar5 = vpaddw_avx2(auVar11,auVar14);
          auVar6 = vpaddw_avx2(auVar2,auVar1);
          auVar5 = vpaddw_avx2(auVar5,auVar6);
          auVar5 = vpmaddwd_avx2(auVar5,auVar13);
          auVar5 = vpaddd_avx2(auVar5,auVar12._0_32_);
          auVar12 = ZEXT3264(auVar5);
          auVar14 = vpmaddwd_avx2(auVar14,auVar14);
          auVar14 = vpaddd_avx2(auVar14,auVar15._0_32_);
          auVar11 = vpmaddwd_avx2(auVar11,auVar11);
          auVar1 = vpmaddwd_avx2(auVar1,auVar1);
          auVar11 = vpaddd_avx2(auVar11,auVar1);
          auVar14 = vpaddd_avx2(auVar14,auVar11);
          auVar11 = vpmaddwd_avx2(auVar2,auVar2);
          auVar14 = vpaddd_avx2(auVar14,auVar11);
          auVar15 = ZEXT3264(auVar14);
          lVar9 = lVar9 + 0x10;
          pauVar8 = pauVar8 + 1;
        } while (lVar9 < width);
      }
      auVar11 = auVar12._0_32_;
      auVar1 = vpunpckldq_avx2(auVar14,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar14 = vpunpckhdq_avx2(auVar14,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
      auVar14 = vpaddq_avx2(auVar10._0_32_,auVar14);
      auVar14 = vpaddq_avx2(auVar14,auVar1);
      auVar10 = ZEXT3264(auVar14);
      iVar7 = iVar7 + 4;
      src = (int16_t *)(*(undefined1 (*) [32])src + (long)(stride * 4) * 2);
    } while (iVar7 < height);
  }
  auVar3 = vphaddd_avx(auVar11._16_16_,auVar11._0_16_);
  auVar3 = vphaddd_avx(auVar3,auVar3);
  auVar3 = vphaddd_avx(auVar3,auVar3);
  *sum = *sum + auVar3._0_4_;
  auVar3 = vpaddq_avx(auVar14._0_16_,auVar14._16_16_);
  auVar4 = vpshufd_avx(auVar3,0xee);
  auVar3 = vpaddq_avx(auVar4,auVar3);
  return auVar3._0_8_;
}

Assistant:

static uint64_t aom_sum_sse_2d_i16_nxn_avx2(const int16_t *src, int stride,
                                            int width, int height, int *sum) {
  uint64_t result;
  const __m256i zero_reg = _mm256_setzero_si256();
  const __m256i one_reg = _mm256_set1_epi16(1);

  __m256i v_sse_total = zero_reg;
  __m256i v_sum_total = zero_reg;

  for (int col = 0; col < height; col += 4) {
    __m256i v_sse_row = zero_reg;
    for (int row = 0; row < width; row += 16) {
      const int16_t *tempsrc = src + row;
      const __m256i v_val_0_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 0 * stride));
      const __m256i v_val_1_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 1 * stride));
      const __m256i v_val_2_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 2 * stride));
      const __m256i v_val_3_w =
          _mm256_loadu_si256((const __m256i *)(tempsrc + 3 * stride));

      const __m256i v_sum_01 = _mm256_add_epi16(v_val_0_w, v_val_1_w);
      const __m256i v_sum_23 = _mm256_add_epi16(v_val_2_w, v_val_3_w);
      __m256i v_sum_0123 = _mm256_add_epi16(v_sum_01, v_sum_23);
      v_sum_0123 = _mm256_madd_epi16(v_sum_0123, one_reg);
      v_sum_total = _mm256_add_epi32(v_sum_total, v_sum_0123);

      const __m256i v_sq_0_d = _mm256_madd_epi16(v_val_0_w, v_val_0_w);
      const __m256i v_sq_1_d = _mm256_madd_epi16(v_val_1_w, v_val_1_w);
      const __m256i v_sq_2_d = _mm256_madd_epi16(v_val_2_w, v_val_2_w);
      const __m256i v_sq_3_d = _mm256_madd_epi16(v_val_3_w, v_val_3_w);
      const __m256i v_sq_01_d = _mm256_add_epi32(v_sq_0_d, v_sq_1_d);
      const __m256i v_sq_23_d = _mm256_add_epi32(v_sq_2_d, v_sq_3_d);
      const __m256i v_sq_0123_d = _mm256_add_epi32(v_sq_01_d, v_sq_23_d);
      v_sse_row = _mm256_add_epi32(v_sse_row, v_sq_0123_d);
    }
    const __m256i v_sse_row_low = _mm256_unpacklo_epi32(v_sse_row, zero_reg);
    const __m256i v_sse_row_hi = _mm256_unpackhi_epi32(v_sse_row, zero_reg);
    v_sse_row = _mm256_add_epi64(v_sse_row_low, v_sse_row_hi);
    v_sse_total = _mm256_add_epi64(v_sse_total, v_sse_row);
    src += 4 * stride;
  }

  const __m128i v_sum_total_low = _mm256_castsi256_si128(v_sum_total);
  const __m128i v_sum_total_hi = _mm256_extracti128_si256(v_sum_total, 1);
  __m128i sum_128bit = _mm_add_epi32(v_sum_total_hi, v_sum_total_low);
  sum_128bit = _mm_add_epi32(sum_128bit, _mm_srli_si128(sum_128bit, 8));
  sum_128bit = _mm_add_epi32(sum_128bit, _mm_srli_si128(sum_128bit, 4));
  *sum += _mm_cvtsi128_si32(sum_128bit);

  __m128i v_sse_total_lo = _mm256_castsi256_si128(v_sse_total);
  __m128i v_sse_total_hi = _mm256_extracti128_si256(v_sse_total, 1);
  __m128i sse_128bit = _mm_add_epi64(v_sse_total_lo, v_sse_total_hi);

  sse_128bit =
      _mm_add_epi64(sse_128bit, _mm_unpackhi_epi64(sse_128bit, sse_128bit));

  xx_storel_64(&result, sse_128bit);

  return result;
}